

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

_Bool rf_check_collision_box_sphere(rf_bounding_box box,rf_vec3 center,float radius)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = center.z;
  fVar1 = center.x;
  if (box.min.x <= fVar1) {
    fVar3 = 0.0;
    box.min.x = box.max.x;
    if (fVar1 <= box.max.x) goto LAB_0012357b;
  }
  fVar3 = (fVar1 - box.min.x) * (fVar1 - box.min.x);
LAB_0012357b:
  fVar1 = center.y;
  if ((fVar1 < box.min.y) || (box.min.y = box.max.y, box.max.y < fVar1)) {
    fVar3 = fVar3 + (fVar1 - box.min.y) * (fVar1 - box.min.y);
  }
  if ((fVar2 < box.min.z) || (box.min.z = box.max.z, box.max.z < fVar2)) {
    fVar3 = fVar3 + (fVar2 - box.min.z) * (fVar2 - box.min.z);
  }
  return fVar3 <= radius * radius;
}

Assistant:

RF_API bool rf_check_collision_box_sphere(rf_bounding_box box, rf_vec3 center, float radius)
{
    bool collision = false;

    float dmin = 0;

    if (center.x < box.min.x) dmin += powf(center.x - box.min.x, 2);
    else if (center.x > box.max.x) dmin += powf(center.x - box.max.x, 2);

    if (center.y < box.min.y) dmin += powf(center.y - box.min.y, 2);
    else if (center.y > box.max.y) dmin += powf(center.y - box.max.y, 2);

    if (center.z < box.min.z) dmin += powf(center.z - box.min.z, 2);
    else if (center.z > box.max.z) dmin += powf(center.z - box.max.z, 2);

    if (dmin <= (radius * radius)) collision = true;

    return collision;
}